

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall Timer::run_local(Timer *this)

{
  bool bVar1;
  const_reference pvVar2;
  rep rVar3;
  undefined1 local_b8 [72];
  type diff;
  value_type s;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  Timer *this_local;
  
  lock._8_8_ = this;
  while (bVar1 = std::atomic<bool>::load(&this->tm_running,seq_cst), bVar1) {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->tm_mutex);
    bVar1 = std::
            priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
            ::empty(&this->tm_queue);
    if (bVar1) {
      std::condition_variable::wait((unique_lock *)&this->tm_cond);
      s.tn_period.__r._0_4_ = 2;
    }
    else {
      pvVar2 = std::
               priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
               ::top(&this->tm_queue);
      TimerNode::TimerNode((TimerNode *)&diff,pvVar2);
      local_b8._56_8_ = std::chrono::_V2::system_clock::now();
      local_b8._64_8_ =
           std::chrono::operator-
                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&diff,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)(local_b8 + 0x38));
      local_b8._48_8_ =
           std::chrono::
           duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                     ((duration<long,_std::ratio<1L,_1000000000L>_> *)(local_b8 + 0x40));
      rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000L>_> *)(local_b8 + 0x30));
      if (rVar3 < 1) {
        std::
        priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
        ::pop(&this->tm_queue);
        bVar1 = hash_map<int,_Timer::IdState>::is_key_exist
                          (&this->tm_id_state_map,(int *)((long)&s.tn_callback._M_invoker + 4));
        if (bVar1) {
          if (((byte)s.tn_id & 1) == 0) {
            if (((s.tn_id._1_1_ & 1) != 0) && (0 < s.repeated_id)) {
              local_b8._16_8_ = std::chrono::_V2::system_clock::now();
              local_b8._24_8_ =
                   std::chrono::operator+
                             ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)(local_b8 + 0x10),
                              (duration<long,_std::ratio<1L,_1000L>_> *)&s.tn_repeated_num);
              s.repeated_id = s.repeated_id + -1;
              diff.__r = local_b8._24_8_;
              std::
              priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
              ::push(&this->tm_queue,(value_type *)&diff);
            }
          }
          else {
            local_b8._32_8_ = std::chrono::_V2::system_clock::now();
            local_b8._40_8_ =
                 std::chrono::operator+
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)(local_b8 + 0x20),
                            (duration<long,_std::ratio<1L,_1000L>_> *)&s.tn_repeated_num);
            diff.__r = local_b8._40_8_;
            std::
            priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
            ::push(&this->tm_queue,(value_type *)&diff);
          }
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
          Threadpool::post_task<std::function<void()>>
                    ((Threadpool *)local_b8,(function<void_()> *)&this->tm_thread_pool);
          std::future<void>::~future((future<void> *)local_b8);
          s.tn_period.__r._0_4_ = 0;
        }
        else {
          s.tn_period.__r._0_4_ = 2;
        }
      }
      else {
        std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
                  (&this->tm_cond,(unique_lock<std::mutex> *)local_20,
                   (duration<long,_std::ratio<1L,_1000000000L>_> *)(local_b8 + 0x40));
        s.tn_period.__r._0_4_ = 2;
      }
      TimerNode::~TimerNode((TimerNode *)&diff);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  }
  return;
}

Assistant:

void run_local()
    {
        while (tm_running.load()) {
            unique_lock<mutex> lock(tm_mutex);
            if (tm_queue.empty()) {
                tm_cond.wait(lock);
                continue;
            }
            auto s = tm_queue.top();
            auto diff = s.tn_tm_point - chrono::high_resolution_clock::now();
            if (chrono::duration_cast<chrono::milliseconds>(diff).count() > 0) {
                tm_cond.wait_for(lock, diff);
                continue;
            } else {
                tm_queue.pop();
                if(!tm_id_state_map.is_key_exist(s.tn_id))
                {
                    continue;
                }
                if(s.tn_is_period)
                {
                    s.tn_tm_point = chrono::high_resolution_clock::now() + s.tn_period;
                    tm_queue.push(s);
                }
                else if(s.tn_is_repeated && s.tn_repeated_num>0)
                {
                    s.tn_tm_point = chrono::high_resolution_clock::now() + s.tn_period;
                    s.tn_repeated_num--;
                    tm_queue.push(s);
                }
                lock.unlock();
                tm_thread_pool.post_task(move(s.tn_callback));
            }
        }
    }